

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Status XML_ResumeParser(XML_Parser parser)

{
  XML_Parsing XVar1;
  XML_Error XVar2;
  XML_Status XVar3;
  
  XVar3 = XML_STATUS_ERROR;
  if (parser != (XML_Parser)0x0) {
    if ((parser->m_parsingStatus).parsing == XML_SUSPENDED) {
      (parser->m_parsingStatus).parsing = XML_PARSING;
      XVar2 = (*parser->m_processor)
                        (parser,parser->m_bufferPtr,parser->m_parseEndPtr,&parser->m_bufferPtr);
      parser->m_errorCode = XVar2;
      if (XVar2 == XML_ERROR_NONE) {
        XVar1 = (parser->m_parsingStatus).parsing;
        XVar3 = XML_STATUS_OK;
        if (XVar1 < XML_FINISHED) {
          if ((parser->m_parsingStatus).finalBuffer != '\0') {
            (parser->m_parsingStatus).parsing = XML_FINISHED;
            return XML_STATUS_OK;
          }
        }
        else if (XVar1 == XML_SUSPENDED) {
          XVar3 = XML_STATUS_SUSPENDED;
        }
        (*parser->m_encoding->updatePosition)
                  (parser->m_encoding,parser->m_positionPtr,parser->m_bufferPtr,&parser->m_position)
        ;
        parser->m_positionPtr = parser->m_bufferPtr;
      }
      else {
        parser->m_eventEndPtr = parser->m_eventPtr;
        parser->m_processor = errorProcessor;
      }
    }
    else {
      parser->m_errorCode = XML_ERROR_NOT_SUSPENDED;
      XVar3 = XML_STATUS_ERROR;
    }
  }
  return XVar3;
}

Assistant:

enum XML_Status XMLCALL
XML_ResumeParser(XML_Parser parser) {
  enum XML_Status result = XML_STATUS_OK;

  if (parser == NULL)
    return XML_STATUS_ERROR;
  if (parser->m_parsingStatus.parsing != XML_SUSPENDED) {
    parser->m_errorCode = XML_ERROR_NOT_SUSPENDED;
    return XML_STATUS_ERROR;
  }
  parser->m_parsingStatus.parsing = XML_PARSING;

  parser->m_errorCode = parser->m_processor(
      parser, parser->m_bufferPtr, parser->m_parseEndPtr, &parser->m_bufferPtr);

  if (parser->m_errorCode != XML_ERROR_NONE) {
    parser->m_eventEndPtr = parser->m_eventPtr;
    parser->m_processor = errorProcessor;
    return XML_STATUS_ERROR;
  } else {
    switch (parser->m_parsingStatus.parsing) {
    case XML_SUSPENDED:
      result = XML_STATUS_SUSPENDED;
      break;
    case XML_INITIALIZED:
    case XML_PARSING:
      if (parser->m_parsingStatus.finalBuffer) {
        parser->m_parsingStatus.parsing = XML_FINISHED;
        return result;
      }
    default:;
    }
  }

  XmlUpdatePosition(parser->m_encoding, parser->m_positionPtr,
                    parser->m_bufferPtr, &parser->m_position);
  parser->m_positionPtr = parser->m_bufferPtr;
  return result;
}